

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

int ieee_ex_to_mips_mips64(int xcpt)

{
  if (xcpt != 0) {
    return (uint)xcpt >> 5 & 1 |
           ((uint)xcpt >> 3 & 2 | (uint)xcpt >> 1 & 4 | (xcpt & 1U) << 4) + (xcpt & 4U) * 2;
  }
  return 0;
}

Assistant:

int ieee_ex_to_mips(int xcpt)
{
    int ret = 0;
    if (xcpt) {
        if (xcpt & float_flag_invalid) {
            ret |= FP_INVALID;
        }
        if (xcpt & float_flag_overflow) {
            ret |= FP_OVERFLOW;
        }
        if (xcpt & float_flag_underflow) {
            ret |= FP_UNDERFLOW;
        }
        if (xcpt & float_flag_divbyzero) {
            ret |= FP_DIV0;
        }
        if (xcpt & float_flag_inexact) {
            ret |= FP_INEXACT;
        }
    }
    return ret;
}